

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

PVG_FT_Error
ft_stroke_border_cubicto
          (PVG_FT_StrokeBorder border,PVG_FT_Vector *control1,PVG_FT_Vector *control2,
          PVG_FT_Vector *to)

{
  PVG_FT_Error PVar1;
  PVG_FT_Vector *pPVar2;
  PVG_FT_Byte *pPVar3;
  PVG_FT_Byte *tag;
  PVG_FT_Vector *vec;
  PVG_FT_Error error;
  PVG_FT_Vector *to_local;
  PVG_FT_Vector *control2_local;
  PVG_FT_Vector *control1_local;
  PVG_FT_StrokeBorder border_local;
  
  if (-1 < border->start) {
    PVar1 = ft_stroke_border_grow(border,3);
    if (PVar1 == 0) {
      pPVar2 = border->points + border->num_points;
      pPVar3 = border->tags + border->num_points;
      pPVar2->x = control1->x;
      pPVar2->y = control1->y;
      pPVar2[1].x = control2->x;
      pPVar2[1].y = control2->y;
      pPVar2[2].x = to->x;
      pPVar2[2].y = to->y;
      *pPVar3 = '\x02';
      pPVar3[1] = '\x02';
      pPVar3[2] = '\x01';
      border->num_points = border->num_points + 3;
    }
    border->movable = '\0';
    return PVar1;
  }
  __assert_fail("border->start >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-ft-stroker.c"
                ,0x186,
                "PVG_FT_Error ft_stroke_border_cubicto(PVG_FT_StrokeBorder, PVG_FT_Vector *, PVG_FT_Vector *, PVG_FT_Vector *)"
               );
}

Assistant:

static PVG_FT_Error ft_stroke_border_cubicto(PVG_FT_StrokeBorder border,
                                            PVG_FT_Vector*      control1,
                                            PVG_FT_Vector*      control2,
                                            PVG_FT_Vector*      to)
{
    PVG_FT_Error error;

    assert(border->start >= 0);

    error = ft_stroke_border_grow(border, 3);
    if (!error) {
        PVG_FT_Vector* vec = border->points + border->num_points;
        PVG_FT_Byte*   tag = border->tags + border->num_points;

        vec[0] = *control1;
        vec[1] = *control2;
        vec[2] = *to;

        tag[0] = PVG_FT_STROKE_TAG_CUBIC;
        tag[1] = PVG_FT_STROKE_TAG_CUBIC;
        tag[2] = PVG_FT_STROKE_TAG_ON;

        border->num_points += 3;
    }

    border->movable = FALSE;

    return error;
}